

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void absl::lts_20250127::str_format_internal::anon_unknown_0::FractionalDigitGenerator::
     RunConversion(uint128 v,int exp,
                  FunctionRef<void_(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator)>
                  f)

{
  Invoker<void,_absl::lts_20250127::Span<unsigned_int>_> p_Var1;
  Func f_00;
  VoidPtr local_78;
  VoidPtr local_70;
  Invoker<void,_absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator>
  local_68;
  uint64_t local_60;
  int local_58;
  size_t local_40;
  VoidPtr local_38;
  int local_2c;
  VoidPtr VStack_28;
  int exp_local;
  FunctionRef<void_(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator)>
  f_local;
  uint128 v_local;
  
  local_60 = v.hi_;
  local_68 = (Invoker<void,_absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator>
              )v.lo_;
  local_70 = (VoidPtr)f.invoker_;
  local_78 = f.ptr_;
  local_2c = exp;
  VStack_28 = local_78;
  f_local.ptr_ = local_70;
  f_local.invoker_ = local_68;
  if (-1 < -exp) {
    __assert_fail("-exp < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0xfe,
                  "static void absl::str_format_internal::(anonymous namespace)::FractionalDigitGenerator::RunConversion(uint128, int, absl::FunctionRef<void (FractionalDigitGenerator)>)"
                 );
  }
  if (-0x407e < -exp) {
    p_Var1 = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)0x20;
    local_58 = exp;
    FunctionRef<void(absl::lts_20250127::Span<unsigned_int>)>::
    FunctionRef<absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator::RunConversion(absl::lts_20250127::uint128,int,absl::lts_20250127::FunctionRef<void(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator)>)::_lambda(absl::lts_20250127::Span<unsigned_int>)_1_,void>
              ((FunctionRef<void(absl::lts_20250127::Span<unsigned_int>)> *)&local_40,
               (anon_class_48_3_b782238c *)&local_78);
    f_00.invoker_ = p_Var1;
    f_00.ptr_.obj = local_38.obj;
    StackArray::RunWithCapacity((StackArray *)(long)((exp + 0x5f) / 0x20),local_40,f_00);
    return;
  }
  __assert_fail("-exp >= Limits::min_exponent - 128",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                ,0xff,
                "static void absl::str_format_internal::(anonymous namespace)::FractionalDigitGenerator::RunConversion(uint128, int, absl::FunctionRef<void (FractionalDigitGenerator)>)"
               );
}

Assistant:

static void RunConversion(
      uint128 v, int exp, absl::FunctionRef<void(FractionalDigitGenerator)> f) {
    using Limits = std::numeric_limits<MaxFloatType>;
    assert(-exp < 0);
    assert(-exp >= Limits::min_exponent - 128);
    static_assert(StackArray::kMaxCapacity >=
                      (Limits::digits + 128 - Limits::min_exponent + 31) / 32,
                  "");
    StackArray::RunWithCapacity(
        static_cast<size_t>((Limits::digits + exp + 31) / 32),
        [=](absl::Span<uint32_t> input) {
          f(FractionalDigitGenerator(input, v, exp));
        });
  }